

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O2

void __thiscall
chrono::ChCoordsys<double>::ArchiveIN(ChCoordsys<double> *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChQuaternion<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChCoordsys<double>>(marchive);
  local_30._name = "pos";
  local_30._flags = '\0';
  local_30._value = &this->pos;
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->rot;
  local_48._name = "rot";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ArchiveIN(ChArchiveIn& marchive) {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<ChCoordsys<double>>();
        // stream in all member data
        marchive >> CHNVP(pos);
        marchive >> CHNVP(rot);
    }